

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O1

bool __thiscall
cmSourceGroupCommand::processTree
          (cmSourceGroupCommand *this,ParsedArguments *parsedArguments,string *errorMsg)

{
  _Rb_tree_node_base *path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  mapped_type *pmVar6;
  string *psVar7;
  long *plVar8;
  char *pcVar9;
  cmSourceGroup *this_00;
  _Rb_tree_node_base *p_Var10;
  size_type *psVar11;
  pointer pbVar12;
  pointer pbVar13;
  __string_type __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenizedPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceGroupPaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesVector;
  string prefix;
  string root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  undefined1 local_100 [32];
  _Rb_tree_node_base *local_e0;
  size_t local_d8;
  cmMakefile *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string *local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b0 = errorMsg;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](parsedArguments,
                        (key_type *)(anonymous_namespace)::kTreeOptionName_abi_cxx11_);
  cmsys::SystemTools::CollapseFullPath
            (&local_88,
             (pmVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](parsedArguments,
                        (key_type *)(anonymous_namespace)::kPrefixOptionName_abi_cxx11_);
  if ((pmVar6->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (pmVar6->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  }
  else {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](parsedArguments,
                          (key_type *)(anonymous_namespace)::kPrefixOptionName_abi_cxx11_);
    pbVar13 = (pmVar6->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_a8 = local_98;
    pcVar3 = (pbVar13->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar3,pcVar3 + pbVar13->_M_string_length);
  }
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](parsedArguments,
                        (key_type *)(anonymous_namespace)::kFilesOptionName_abi_cxx11_);
  psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = (cmMakefile *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_c8,
            (long)(pmVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pmVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar13 = (pmVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (pmVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar12) {
    do {
      bVar4 = cmsys::SystemTools::FileExists(pbVar13,true);
      if (bVar4) {
        bVar4 = cmsys::SystemTools::FileIsFullPath(pbVar13);
        if (bVar4) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_138,pbVar13);
        }
        else {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          pcVar3 = (psVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar3,pcVar3 + psVar7->_M_string_length);
          std::__cxx11::string::append((char *)&local_158);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_158,(ulong)(pbVar13->_M_dataplus)._M_p);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar11) {
            local_100._16_8_ = *psVar11;
            local_100._24_8_ = plVar8[3];
            local_100._0_8_ = local_100 + 0x10;
          }
          else {
            local_100._16_8_ = *psVar11;
            local_100._0_8_ = (size_type *)*plVar8;
          }
          local_100._8_8_ = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          cmsys::SystemTools::CollapseFullPath((string *)&local_138,(string *)local_100);
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_allocated_capacity != &local_128) {
          operator_delete((void *)local_138._M_allocated_capacity,
                          local_128._M_allocated_capacity + 1);
        }
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar12);
  }
  pbVar13 = local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar4) {
    bVar4 = false;
    pbVar12 = local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar5 = cmsys::SystemTools::StringStartsWith(pbVar12,local_88._M_dataplus._M_p);
      if (!bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_138,"ROOT: ",&local_88);
        plVar8 = (long *)std::__cxx11::string::append(local_138._M_local_buf);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_158.field_2._M_allocated_capacity = *psVar11;
          local_158.field_2._8_8_ = plVar8[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar11;
          local_158._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_158._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_158,(ulong)(pbVar12->_M_dataplus)._M_p);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar11) {
          local_100._16_8_ = *psVar11;
          local_100._24_8_ = plVar8[3];
          local_100._0_8_ = local_100 + 0x10;
        }
        else {
          local_100._16_8_ = *psVar11;
          local_100._0_8_ = (size_type *)*plVar8;
        }
        local_100._8_8_ = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_b0,(string *)local_100);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_allocated_capacity != &local_128) {
          operator_delete((void *)local_138._M_allocated_capacity,
                          local_128._M_allocated_capacity + 1);
        }
        if (!bVar5) break;
      }
      pbVar12 = pbVar12 + 1;
      bVar4 = pbVar12 == pbVar13;
    } while (!bVar4);
  }
  pbVar13 = local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar4) {
    local_100._24_8_ = local_100 + 8;
    local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
    local_100._16_8_ = 0;
    local_d8 = 0;
    local_e0 = (_Rb_tree_node_base *)local_100._24_8_;
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::string::substr((ulong)&local_158,(ulong)pbVar12);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_100,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar13);
    }
    bVar4 = (_Rb_tree_node_base *)local_100._24_8_ == (_Rb_tree_node_base *)(local_100 + 8);
    if (!bVar4) {
      local_d0 = (cmMakefile *)
                 (local_d0->FindPackageRootPathStack).
                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size;
      bVar4 = false;
      p_Var10 = (_Rb_tree_node_base *)local_100._24_8_;
      do {
        path = p_Var10 + 1;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_a0 == 0) {
          anon_unknown.dwarf_988c14::tokenizePath
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_138,(string *)path);
          local_158.field_2._M_allocated_capacity =
               (size_type)
               local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_158._M_string_length =
               (size_type)
               local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_158._M_dataplus._M_p =
               (pointer)local_118.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._M_allocated_capacity;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_128._M_allocated_capacity;
          local_138._M_allocated_capacity = 0;
          local_138._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_128._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_158);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_138);
        }
        else {
          local_138._M_allocated_capacity = (size_type)&local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_a8,local_a0 + (long)local_a8);
          std::__cxx11::string::_M_replace_aux((ulong)&local_138,local_138._8_8_,0,'\x01');
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     (local_138._M_local_buf,*(ulong *)(p_Var10 + 1));
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_158.field_2._M_allocated_capacity = *psVar11;
            local_158.field_2._8_8_ = plVar8[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar11;
            local_158._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_158._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          anon_unknown.dwarf_988c14::tokenizePath(&local_48,&local_158);
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_allocated_capacity != &local_128) {
            operator_delete((void *)local_138._M_allocated_capacity,
                            local_128._M_allocated_capacity + 1);
          }
        }
        if (local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)local_118.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -0x20);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)local_118.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -0x20);
          pcVar9 = (char *)((long)local_118.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -0x10);
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar1;
          if ((char *)paVar2->_M_allocated_capacity != pcVar9) {
            operator_delete((char *)paVar2->_M_allocated_capacity,*(long *)pcVar9 + 1);
          }
          if (local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(&local_118);
          }
          this_00 = cmMakefile::GetOrCreateSourceGroup(local_d0,&local_118);
          if (this_00 == (cmSourceGroup *)0x0) {
            std::operator+(&local_158,"Could not create source group for file: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path
                          );
            std::__cxx11::string::operator=((string *)local_b0,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_118);
            break;
          }
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          bVar4 = cmsys::SystemTools::FileIsFullPath((string *)path);
          if (!bVar4) {
            std::__cxx11::string::_M_assign((string *)&local_158);
            std::__cxx11::string::append((char *)&local_158);
            std::__cxx11::string::_M_append((char *)&local_158,*(ulong *)(p_Var10 + 1));
          }
          cmsys::SystemTools::CollapseFullPath((string *)&local_138,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          cmSourceGroup::AddGroupFile(this_00,(string *)&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_allocated_capacity != &local_128) {
            operator_delete((void *)local_138._M_allocated_capacity,
                            local_128._M_allocated_capacity + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        bVar4 = p_Var10 == (_Rb_tree_node_base *)(local_100 + 8);
      } while (!bVar4);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
  }
  else {
    bVar4 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmSourceGroupCommand::processTree(ParsedArguments& parsedArguments,
                                       std::string& errorMsg)
{
  const std::string root =
    cmSystemTools::CollapseFullPath(parsedArguments[kTreeOptionName].front());
  std::string prefix = parsedArguments[kPrefixOptionName].empty()
    ? ""
    : parsedArguments[kPrefixOptionName].front();

  const std::vector<std::string> filesVector =
    prepareFilesPathsForTree(parsedArguments[kFilesOptionName],
                             this->Makefile->GetCurrentSourceDirectory());

  if (!rootIsPrefix(root, filesVector, errorMsg)) {
    return false;
  }

  std::set<std::string> sourceGroupPaths =
    getSourceGroupFilesPaths(root, filesVector);

  return addFilesToItsSourceGroups(root, sourceGroupPaths, prefix,
                                   *(this->Makefile), errorMsg);
}